

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv__custom_sem_init(uv_sem_t *sem_,uint value)

{
  uv_mutex_t *mutex;
  uv_semaphore_t *sem;
  int err;
  uint value_local;
  uv_sem_t *sem__local;
  
  mutex = (uv_mutex_t *)uv__malloc(0x60);
  if (mutex == (uv_mutex_t *)0x0) {
    sem__local._4_4_ = -0xc;
  }
  else {
    sem__local._4_4_ = uv_mutex_init(mutex);
    if (sem__local._4_4_ == 0) {
      sem__local._4_4_ = uv_cond_init((uv_cond_t *)(mutex + 1));
      if (sem__local._4_4_ == 0) {
        *(uint *)((long)mutex + 0x58) = value;
        *(uv_mutex_t **)sem_ = mutex;
        sem__local._4_4_ = 0;
      }
      else {
        uv_mutex_destroy(mutex);
        uv__free(mutex);
      }
    }
    else {
      uv__free(mutex);
    }
  }
  return sem__local._4_4_;
}

Assistant:

static int uv__custom_sem_init(uv_sem_t* sem_, unsigned int value) {
  int err;
  uv_semaphore_t* sem;

  sem = uv__malloc(sizeof(*sem));
  if (sem == NULL)
    return UV_ENOMEM;

  if ((err = uv_mutex_init(&sem->mutex)) != 0) {
    uv__free(sem);
    return err;
  }

  if ((err = uv_cond_init(&sem->cond)) != 0) {
    uv_mutex_destroy(&sem->mutex);
    uv__free(sem);
    return err;
  }

  sem->value = value;
  *(uv_semaphore_t**)sem_ = sem;
  return 0;
}